

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O0

void __thiscall tf::Taskflow::_dump(Taskflow *this,ostream *os,Graph *graph,Dumper *dumper)

{
  mapped_type mVar1;
  bool bVar2;
  char *pcVar3;
  add_pointer_t<tf::Node::Module> ptVar4;
  ostream *poVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  reference ppNVar8;
  mapped_type *in_RCX;
  int __c;
  ostream *in_RSI;
  unique_ptr<tf::Node,_std::default_delete<tf::Node>_> **__s;
  Node *in_RDI;
  size_t i;
  Graph *module;
  Node *n;
  const_iterator itr;
  value_type *in_stack_ffffffffffffff68;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_stack_ffffffffffffff70;
  Dumper *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff98;
  Node *in_stack_ffffffffffffffa0;
  _Node_iterator_base<std::pair<const_tf::Graph_*const,_unsigned_long>,_false> local_50;
  _Node_iterator_base<std::pair<const_tf::Graph_*const,_unsigned_long>,_false> local_48;
  Graph *local_40;
  pointer local_38;
  unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *local_30;
  __normal_iterator<const_std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  local_28;
  mapped_type *local_20;
  ostream *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_28._M_current =
       (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)
       std::
       vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ::begin((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                *)in_stack_ffffffffffffff68);
  while( true ) {
    local_30 = (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)
               std::
               vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ::end((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                      *)in_stack_ffffffffffffff68);
    __s = &local_30;
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
    ::operator->(&local_28);
    local_38 = std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::get
                         ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)
                          in_stack_ffffffffffffff70);
    pcVar3 = std::
             variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             ::index(&local_38->_handle,(char *)__s,__c);
    if (pcVar3 == (char *)0x6) {
      ptVar4 = std::
               get_if<tf::Node::Module,std::monostate,tf::Node::Static,tf::Node::Runtime,tf::Node::Subflow,tf::Node::Condition,tf::Node::MultiCondition,tf::Node::Module,tf::Node::Async,tf::Node::DependentAsync>
                         ((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                           *)0x1329ad);
      local_40 = ptVar4->graph;
      poVar5 = std::operator<<(local_10,'p');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_38);
      std::operator<<(poVar5,"[shape=box3d, color=blue, label=\"");
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::operator<<(local_10,(string *)&local_38->_name);
      }
      else {
        poVar5 = std::operator<<(local_10,'p');
        std::ostream::operator<<(poVar5,local_38);
      }
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
           ::find((unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
                   *)in_stack_ffffffffffffff68,(key_type *)0x132a41);
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
           ::end((unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
                  *)in_stack_ffffffffffffff68);
      bVar2 = std::__detail::operator==(&local_48,&local_50);
      if (bVar2) {
        mVar1 = *local_20;
        *local_20 = mVar1 + 1;
        pmVar7 = std::
                 unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
                 ::operator[]((unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
                               *)in_stack_ffffffffffffff70,(key_type *)in_stack_ffffffffffffff68);
        *pmVar7 = mVar1;
        in_stack_ffffffffffffff88 = (Dumper *)(local_20 + 1);
        std::pair<const_tf::Node_*,_const_tf::Graph_*>::pair<tf::Node_*&,_tf::Graph_*&,_true>
                  ((pair<const_tf::Node_*,_const_tf::Graph_*> *)&stack0xffffffffffffffa0,&local_38,
                   &local_40);
        std::
        stack<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::deque<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>_>
        ::push((stack<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::deque<std::pair<const_tf::Node_*,_const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Node_*,_const_tf::Graph_*>_>_>_>
                *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      poVar5 = std::operator<<(local_10," [m");
      pmVar7 = std::
               unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
               ::operator[]((unordered_map<const_tf::Graph_*,_unsigned_long,_std::hash<const_tf::Graph_*>,_std::equal_to<const_tf::Graph_*>,_std::allocator<std::pair<const_tf::Graph_*const,_unsigned_long>_>_>
                             *)in_stack_ffffffffffffff70,(key_type *)in_stack_ffffffffffffff68);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pmVar7);
      std::operator<<(poVar5,"]\"];\n");
      for (in_stack_ffffffffffffff98 = (ostream *)0x0;
          in_stack_ffffffffffffff98 < (ostream *)local_38->_num_successors;
          in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 + 1) {
        poVar5 = std::operator<<(local_10,'p');
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_38);
        poVar5 = std::operator<<(poVar5,"->");
        in_stack_ffffffffffffff70 =
             (SmallVectorTemplateCommon<tf::Node_*,_void> *)std::operator<<(poVar5,'p');
        ppNVar8 = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                            (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
        poVar5 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff70,*ppNVar8);
        std::operator<<(poVar5,";\n");
      }
    }
    else {
      _dump((Taskflow *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_RDI,
            in_stack_ffffffffffffff88);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

inline void Taskflow::_dump(
  std::ostream& os, const Graph* graph, Dumper& dumper
) const {

  for(auto itr = graph->begin(); itr != graph->end(); ++itr) {

    Node* n = itr->get();

    // regular task
    if(n->_handle.index() != Node::MODULE) {
      _dump(os, n, dumper);
    }
    // module task
    else {
      //auto module = &(std::get_if<Node::Module>(&n->_handle)->module);
      auto module = &(std::get_if<Node::Module>(&n->_handle)->graph);

      os << 'p' << n << "[shape=box3d, color=blue, label=\"";
      if(n->_name.empty()) os << 'p' << n;
      else os << n->_name;

      if(dumper.visited.find(module) == dumper.visited.end()) {
        dumper.visited[module] = dumper.id++;
        dumper.stack.push({n, module});
      }

      os << " [m" << dumper.visited[module] << "]\"];\n";

      //for(const auto s : n->_successors) {
      for(size_t i=0; i<n->_num_successors; ++i) {
        os << 'p' << n << "->" << 'p' << n->_edges[i] << ";\n";
      }
    }
  }
}